

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

void drmp3_L3_change_sign(float *grbuf)

{
  int local_18;
  int local_14;
  int i;
  int b;
  float *grbuf_local;
  
  _i = grbuf + 0x12;
  for (local_14 = 0; local_14 < 0x20; local_14 = local_14 + 2) {
    for (local_18 = 1; local_18 < 0x12; local_18 = local_18 + 2) {
      _i[local_18] = -_i[local_18];
    }
    _i = _i + 0x24;
  }
  return;
}

Assistant:

static void drmp3_L3_change_sign(float *grbuf)
{
    int b, i;
    for (b = 0, grbuf += 18; b < 32; b += 2, grbuf += 36)
        for (i = 1; i < 18; i += 2)
            grbuf[i] = -grbuf[i];
}